

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall lunasvg::Length::parse(Length *this,string_view input,LengthNegativeMode mode)

{
  char cVar1;
  bool bVar2;
  const_reference pvVar3;
  float local_30;
  float dpi;
  float value;
  LengthNegativeMode mode_local;
  Length *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (Length *)input._M_len;
  local_30 = 0.0;
  dpi._3_1_ = mode;
  _value = this;
  stripLeadingAndTrailingSpaces((string_view *)&this_local);
  bVar2 = parseNumber<float>((string_view *)&this_local,&local_30);
  if (bVar2) {
    if ((0.0 <= local_30) || (dpi._3_1_ != Forbid)) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      if (bVar2) {
        this->m_value = local_30;
        this->m_units = None;
        input_local._M_str._7_1_ = true;
      }
      else {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        cVar1 = *pvVar3;
        if (cVar1 == '%') {
          this->m_value = local_30;
          this->m_units = Percent;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
        }
        else if (cVar1 == 'c') {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (bVar2) {
            return false;
          }
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (*pvVar3 != 'm') {
            return false;
          }
          this->m_value = (local_30 * 96.0) / 2.54;
          this->m_units = Px;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
        }
        else if (cVar1 == 'e') {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (bVar2) {
            return false;
          }
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (*pvVar3 == 'm') {
            this->m_units = Em;
          }
          else {
            pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                               ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            if (*pvVar3 != 'x') {
              return false;
            }
            this->m_units = Ex;
          }
          this->m_value = local_30;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
        }
        else if (cVar1 == 'i') {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (bVar2) {
            return false;
          }
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (*pvVar3 != 'n') {
            return false;
          }
          this->m_value = local_30 * 96.0;
          this->m_units = Px;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
        }
        else if (cVar1 == 'm') {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (bVar2) {
            return false;
          }
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (*pvVar3 != 'm') {
            return false;
          }
          this->m_value = (local_30 * 96.0) / 25.4;
          this->m_units = Px;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
        }
        else {
          if (cVar1 != 'p') {
            return false;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (bVar2) {
            return false;
          }
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (*pvVar3 == 'x') {
            this->m_value = local_30;
          }
          else {
            pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                               ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            if (*pvVar3 == 'c') {
              this->m_value = (local_30 * 96.0) / 6.0;
            }
            else {
              pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
              if (*pvVar3 != 't') {
                return false;
              }
              this->m_value = (local_30 * 96.0) / 72.0;
            }
          }
          this->m_units = Px;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
        }
        input_local._M_str._7_1_ =
             std::basic_string_view<char,_std::char_traits<char>_>::empty
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      }
    }
    else {
      input_local._M_str._7_1_ = false;
    }
  }
  else {
    input_local._M_str._7_1_ = false;
  }
  return input_local._M_str._7_1_;
}

Assistant:

bool Length::parse(std::string_view input, LengthNegativeMode mode)
{
    float value = 0.f;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value))
        return false;
    if(value < 0.f && mode == LengthNegativeMode::Forbid)
        return false;
    if(input.empty()) {
        m_value = value;
        m_units = LengthUnits::None;
        return true;
    }

    constexpr auto dpi = 96.f;
    switch(input.front()) {
    case '%':
        m_value = value;
        m_units = LengthUnits::Percent;
        input.remove_prefix(1);
        break;
    case 'p':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'x')
            m_value = value;
        else if(input.front() == 'c')
            m_value = value * dpi / 6.f;
        else if(input.front() == 't')
            m_value = value * dpi / 72.f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'i':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'n')
            m_value = value * dpi;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'c':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_value = value * dpi / 2.54f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'm':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_value = value * dpi / 25.4f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'e':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_units = LengthUnits::Em;
        else if(input.front() == 'x')
            m_units = LengthUnits::Ex;
        else
            return false;
        m_value = value;
        input.remove_prefix(1);
        break;
    default:
        return false;
    }

    return input.empty();
}